

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *
wasm::HeapTypeGenerator::makeInhabitable
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  __node_base_ptr *__args;
  pointer pHVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  HeapType HVar5;
  const_iterator cVar6;
  _Hash_node_base *p_Var7;
  Type *pTVar8;
  const_iterator cVar9;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *__x;
  uintptr_t uVar10;
  uintptr_t *puVar11;
  size_t sVar12;
  undefined8 *puVar13;
  Type TVar14;
  _Hash_node_base *p_Var15;
  long lVar16;
  iterator iVar17;
  undefined8 uVar18;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x_00;
  pointer pHVar19;
  byte extraout_DL;
  Type TVar20;
  HeapType *__args_00;
  iterator __position;
  char *pcVar21;
  unsigned_long *__args_01;
  Type *this;
  ulong uVar22;
  undefined1 auVar23 [8];
  ulong uVar24;
  bool bVar25;
  FieldPos field;
  FieldPos field_00;
  Array AVar26;
  Signature SVar27;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar28;
  undefined1 auVar29 [16];
  undefined1 local_288 [8];
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  typeIndices;
  Inhabitator inhabitator;
  Type result;
  HeapType local_1a8;
  HeapType type;
  __node_base local_198;
  __node_base_ptr p_Stack_178;
  _List_node_base *local_170;
  _List_node_base *local_168;
  size_t local_160;
  undefined1 auStack_158 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> deduplicatedIndices;
  _Hash_node_base local_138;
  HeapType root;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_128;
  Type local_110;
  Type param;
  Type *pTStack_100;
  pointer local_f8;
  undefined1 auStack_e8 [8];
  HeapType type_1;
  _Hash_node_base a_Stack_b8 [2];
  HeapType local_a8;
  HeapType next;
  value_type type_3;
  Type TStack_88;
  HeapType heapType;
  pointer local_70;
  undefined1 auStack_58 [8];
  Iterator __begin4;
  TypeBuilder local_38 [8];
  TypeBuilder builder;
  
  pHVar19 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar19 == pHVar1) {
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_288 = (undefined1  [8])&typeIndices._M_h._M_rehash_policy._M_next_resize;
    typeIndices._M_h._M_buckets = (__buckets_ptr)0x1;
    typeIndices._M_h._M_bucket_count = 0;
    typeIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    typeIndices._M_h._M_element_count._0_4_ = 0x3f800000;
    typeIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    typeIndices._M_h._M_rehash_policy._4_4_ = 0;
    typeIndices._M_h._M_rehash_policy._M_next_resize = 0;
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_158 = (undefined1  [8])0x0;
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (HeapType *)0x0;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (HeapType *)0x0;
    __args = &typeIndices._M_h._M_single_bucket;
    do {
      local_1a8.id = pHVar19->id;
      if (local_1a8.id < (__node_base_ptr)0x7d) {
        typeIndices._M_h._M_single_bucket = (__node_base_ptr)0xffffffffffffffff;
        if (deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_158,
                     (iterator)
                     deduplicatedIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,(unsigned_long *)__args);
        }
        else {
          *deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start = 0xffffffffffffffff;
LAB_00198e57:
          deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      else {
        inhabitator.types =
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             ((long)local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
        typeIndices._M_h._M_single_bucket = (__node_base_ptr)local_1a8.id;
        pVar28 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_288,__args);
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&local_128,
                       (iterator)
                       local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&stack0xfffffffffffffe58);
          }
          else {
            (local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish)->id = local_1a8.id;
            local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        __args_01 = (unsigned_long *)
                    ((long)pVar28.first.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                    + 0x10);
        if (deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          *deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start = *__args_01;
          goto LAB_00198e57;
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_158,
                   (iterator)
                   deduplicatedIndices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,__args_01);
      }
      pHVar19 = pHVar19 + 1;
    } while (pHVar19 != pHVar1);
    if ((long)deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start - (long)auStack_158 !=
        (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_start) {
      __assert_fail("deduplicatedIndices.size() == types.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                    ,0x3ea,
                    "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                   );
    }
    typeIndices._M_h._M_single_bucket = (__node_base_ptr)&local_128;
    inhabitator.types =
         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
         &inhabitator.nullables._M_h._M_rehash_policy._M_next_resize;
    inhabitator.nullables._M_h._M_buckets = (__buckets_ptr)0x1;
    inhabitator.nullables._M_h._M_bucket_count = 0;
    inhabitator.nullables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inhabitator.nullables._M_h._M_element_count._0_4_ = 0x3f800000;
    inhabitator.nullables._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inhabitator.nullables._M_h._M_rehash_policy._4_4_ = 0;
    inhabitator.nullables._M_h._M_rehash_policy._M_next_resize = 0;
    SubTypes::SubTypes((SubTypes *)&inhabitator.nullables._M_h._M_single_bucket,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       typeIndices._M_h._M_single_bucket);
    p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
    p_Var15 = typeIndices._M_h._M_single_bucket[1]._M_nxt;
    if (p_Var7 != p_Var15) {
      do {
        auStack_e8 = (undefined1  [8])p_Var7->_M_nxt;
        iVar2 = wasm::HeapType::getKind();
        if (iVar2 != 1) {
          wasm::HeapType::getTypeChildren();
          if (type.id != local_1a8.id) {
            uVar22 = 0;
            do {
              TStack_88.id = (uintptr_t)((__node_base_ptr)(local_1a8.id + uVar22 * 8))->_M_nxt;
              if (((((TStack_88.id & 1) == 0 && (_Hash_node_base *)0x6 < TStack_88.id) &&
                   (HVar5 = Type::getHeapType(&stack0xffffffffffffff78), HVar5.id < 0x7d)) &&
                  (uVar3 = (uint)HVar5.id & 0x7b, (uVar3 << 0x1d | uVar3 - 8 >> 3) - 10 < 5)) &&
                 ((TStack_88.id & 3) == 0 && (_Hash_node_base *)0x6 < TStack_88.id)) {
                field._8_8_ = uVar22 & 0xffffffff;
                field.first.id = (uintptr_t)auStack_e8;
                anon_unknown_24::Inhabitator::markNullable
                          ((Inhabitator *)&typeIndices._M_h._M_single_bucket,field);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < (ulong)((long)(type.id - local_1a8.id) >> 3));
          }
          if ((__node_base_ptr)local_1a8.id != (__node_base_ptr)0x0) {
            operator_delete((void *)local_1a8.id,(long)local_198._M_nxt - local_1a8.id);
          }
        }
        p_Var7 = p_Var7 + 1;
      } while (p_Var7 != p_Var15);
      p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
      p_Var15 = typeIndices._M_h._M_single_bucket[1]._M_nxt;
      if (p_Var7 != p_Var15) {
        do {
          auStack_e8 = (undefined1  [8])p_Var7->_M_nxt;
          iVar2 = wasm::HeapType::getKind();
          if (iVar2 != 1) {
            wasm::HeapType::getTypeChildren();
            if (type.id != local_1a8.id) {
              uVar22 = 0;
              do {
                TStack_88.id = (uintptr_t)((__node_base_ptr)(local_1a8.id + uVar22 * 8))->_M_nxt;
                if ((((TStack_88.id & 1) == 0 && (_Hash_node_base *)0x6 < TStack_88.id) &&
                    (HVar5 = Type::getHeapType(&stack0xffffffffffffff78),
                    ((uint)HVar5.id & 0x7b) == 8 && HVar5.id < 0x7d)) &&
                   ((TStack_88.id & 3) == 0 && (_Hash_node_base *)0x6 < TStack_88.id)) {
                  field_00._8_8_ = uVar22 & 0xffffffff;
                  field_00.first.id = (uintptr_t)auStack_e8;
                  anon_unknown_24::Inhabitator::markNullable
                            ((Inhabitator *)&typeIndices._M_h._M_single_bucket,field_00);
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 < (ulong)((long)(type.id - local_1a8.id) >> 3));
            }
            if ((__node_base_ptr)local_1a8.id != (__node_base_ptr)0x0) {
              operator_delete((void *)local_1a8.id,(long)local_198._M_nxt - local_1a8.id);
            }
          }
          p_Var7 = p_Var7 + 1;
        } while (p_Var7 != p_Var15);
      }
    }
    auStack_e8 = (undefined1  [8])a_Stack_b8;
    type_1.id = 1;
    a_Stack_b8[0]._M_nxt = (_Hash_node_base *)0x0;
    local_1a8.id = (uintptr_t)&stack0xfffffffffffffe88;
    type.id = 1;
    p_Stack_178 = (__node_base_ptr)0x0;
    local_170 = (_List_node_base *)&stack0xfffffffffffffe90;
    local_160 = 0;
    p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
    p_Var15 = typeIndices._M_h._M_single_bucket[1]._M_nxt;
    local_168 = local_170;
    if (p_Var7 != p_Var15) {
      do {
        local_138._M_nxt = p_Var7->_M_nxt;
        cVar6 = std::
                _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)auStack_e8,(key_type *)&local_138);
        if (cVar6.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
          wasm::HeapType::getTypeChildren();
          sVar12 = __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index;
          param.id = (uintptr_t)auStack_58;
          pTStack_100 = __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent;
          local_f8 = (pointer)__begin4.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index;
          auStack_58 = (undefined1  [8])0x0;
          __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
          TStack_88.id = (uintptr_t)local_138._M_nxt;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&heapType,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&param);
          InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
          ::insert((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                    *)&stack0xfffffffffffffe58,
                   (pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                    *)&stack0xffffffffffffff78);
          if (heapType.id != 0) {
            operator_delete((void *)heapType.id,(long)local_70 - heapType.id);
          }
          if (param.id != 0) {
            operator_delete((void *)param.id,sVar12 - param.id);
          }
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,
                            __begin4.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index - (long)auStack_58);
          }
        }
        p_Var7 = p_Var7 + 1;
      } while (p_Var7 != p_Var15);
    }
    std::__cxx11::
    _List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
    ::_M_clear((_List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                *)&stack0xfffffffffffffe90);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&stack0xfffffffffffffe58);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_e8);
    local_1a8.id = (uintptr_t)&stack0xfffffffffffffe88;
    type.id = 1;
    p_Stack_178 = (__node_base_ptr)0x0;
    p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
    if (typeIndices._M_h._M_single_bucket[1]._M_nxt == p_Var7) {
      uVar22 = 0;
    }
    else {
      uVar24 = 0;
      do {
        auStack_e8 = (undefined1  [8])p_Var7[uVar24]._M_nxt;
        type_1.id = uVar24;
        std::
        _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                  ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&stack0xfffffffffffffe58,auStack_e8);
        uVar24 = uVar24 + 1;
        p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
        uVar22 = (long)typeIndices._M_h._M_single_bucket[1]._M_nxt - (long)p_Var7 >> 3;
      } while (uVar24 < uVar22);
    }
    wasm::TypeBuilder::TypeBuilder(local_38,uVar22);
    p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
    p_Var15 = typeIndices._M_h._M_single_bucket[1]._M_nxt;
    if (p_Var15 != p_Var7) {
      TVar20.id = 0;
      do {
        p_Var7 = p_Var7[TVar20.id]._M_nxt;
        uVar4 = wasm::HeapType::getKind();
        switch(uVar4) {
        case 1:
          auVar29 = wasm::HeapType::getSignature();
          root.id = auVar29._8_8_;
          local_138._M_nxt = auVar29._0_8_;
          auStack_e8 = (undefined1  [8])0x0;
          type_1.id = 0;
          __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          auStack_58 = (undefined1  [8])&local_138;
          pTVar8 = (Type *)Type::size((Type *)&local_138);
          if ((__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               == pTVar8) && (auStack_58 == (undefined1  [8])&local_138)) {
            iVar2 = 0;
          }
          else {
            iVar2 = 0;
            do {
              puVar11 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_58);
              local_110.id = *puVar11;
              if (type_1.id == 0) {
                std::vector<wasm::Type,std::allocator<wasm::Type>>::
                _M_realloc_insert<wasm::Type_const&>
                          ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_e8,(iterator)0x0
                           ,&local_110);
              }
              else {
                *(uintptr_t *)type_1.id = local_110.id;
                type_1.id = type_1.id + 8;
              }
              heapType.id._0_4_ = iVar2;
              TStack_88.id = (uintptr_t)p_Var7;
              if ((*(ulong *)(type_1.id - 8) & 1) == 0 && 6 < *(ulong *)(type_1.id - 8)) {
                this = (Type *)(type_1.id - 8);
                local_a8 = Type::getHeapType(this);
                uVar22 = this->id;
                iVar17 = std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&stack0xfffffffffffffe58,&stack0xffffffffffffff58);
                if (iVar17.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                    _M_cur != (__node_type *)0x0) {
                  local_a8.id = wasm::TypeBuilder::getTempHeapType((ulong)local_38);
                }
                cVar9 = std::
                        _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)&inhabitator,(key_type *)&stack0xffffffffffffff78);
                uVar10 = wasm::TypeBuilder::getTempRefType
                                   ((HeapType)local_38,(Nullability)local_a8.id,
                                    (uint)(cVar9.
                                           super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>
                                           ._M_cur != (__node_type *)0x0 ||
                                          6 < uVar22 && ((uint)uVar22 & 3) == 2));
                this->id = uVar10;
              }
              iVar2 = iVar2 + 1;
              __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin4.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while ((__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent != pTVar8) || (auStack_58 != (undefined1  [8])&local_138));
          }
          TStack_88.id = 0;
          heapType.id = 0;
          local_a8.id = (uintptr_t)&root;
          next.id = 0;
          sVar12 = Type::size((Type *)local_a8.id);
          if ((next.id != sVar12) || ((Type *)local_a8.id != (Type *)&root)) {
            do {
              puVar13 = (undefined8 *)
                        wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffff58);
              inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket = (__node_base_ptr)*puVar13;
              if (heapType.id == 0) {
                std::vector<wasm::Type,std::allocator<wasm::Type>>::
                _M_realloc_insert<wasm::Type_const&>
                          ((vector<wasm::Type,std::allocator<wasm::Type>> *)&stack0xffffffffffffff78
                           ,(iterator)0x0,
                           (Type *)&inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket);
              }
              else {
                *(__node_base_ptr *)heapType.id =
                     inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket;
                heapType.id = heapType.id + 8;
              }
              __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)CONCAT44(__begin4.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .parent._4_4_,iVar2);
              auStack_58 = (undefined1  [8])p_Var7;
              if ((*(ulong *)(heapType.id - 8) & 1) == 0 && 6 < *(ulong *)(heapType.id - 8)) {
                pTVar8 = (Type *)(heapType.id - 8);
                local_110.id = (uintptr_t)Type::getHeapType(pTVar8);
                uVar22 = pTVar8->id;
                iVar17 = std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&stack0xfffffffffffffe58,(key_type *)&local_110);
                if (iVar17.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                    _M_cur != (__node_type *)0x0) {
                  local_110.id = wasm::TypeBuilder::getTempHeapType((ulong)local_38);
                }
                cVar9 = std::
                        _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)&inhabitator,(key_type *)auStack_58);
                uVar10 = wasm::TypeBuilder::getTempRefType
                                   ((HeapType)local_38,(Nullability)local_110.id,
                                    (uint)(cVar9.
                                           super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>
                                           ._M_cur != (__node_type *)0x0 ||
                                          6 < uVar22 && ((uint)uVar22 & 3) == 2));
                pTVar8->id = uVar10;
              }
              next.id = next.id + 1;
              iVar2 = iVar2 + 1;
            } while ((next.id != sVar12) || ((Type *)local_a8.id != (Type *)&root));
          }
          TVar14.id = wasm::TypeBuilder::getTempTupleType(local_38);
          wasm::TypeBuilder::getTempTupleType(local_38);
          SVar27.results.id = TVar14.id;
          SVar27.params.id = TVar20.id;
          wasm::TypeBuilder::setHeapType((ulong)local_38,SVar27);
          if ((_Hash_node_base *)TStack_88.id != (_Hash_node_base *)0x0) {
            operator_delete((void *)TStack_88.id,-TStack_88.id);
          }
          break;
        case 2:
          __x = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct();
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_e8,__x);
          if ((undefined1  [8])type_1.id != auStack_e8) {
            lVar16 = 0;
            uVar22 = 0;
            HVar5 = type_1;
            auVar23 = auStack_e8;
            do {
              heapType.id._0_4_ = (int)uVar22;
              uVar24 = *(ulong *)((long)&((_Hash_node_base *)auVar23)->_M_nxt + lVar16);
              TStack_88.id = (uintptr_t)p_Var7;
              if ((uVar24 & 1) == 0 && 6 < uVar24) {
                pTVar8 = (Type *)((long)&((_Hash_node_base *)auVar23)->_M_nxt + lVar16);
                auStack_58 = (undefined1  [8])Type::getHeapType(pTVar8);
                uVar24 = pTVar8->id;
                iVar17 = std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&stack0xfffffffffffffe58,(key_type *)auStack_58);
                if (iVar17.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                    _M_cur != (__node_type *)0x0) {
                  auStack_58 = (undefined1  [8])wasm::TypeBuilder::getTempHeapType((ulong)local_38);
                }
                cVar9 = std::
                        _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)&inhabitator,(key_type *)&stack0xffffffffffffff78);
                uVar10 = wasm::TypeBuilder::getTempRefType
                                   ((HeapType)local_38,auStack_58._0_4_,
                                    (uint)(cVar9.
                                           super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>
                                           ._M_cur != (__node_type *)0x0 ||
                                          6 < uVar24 && ((uint)uVar24 & 3) == 2));
                pTVar8->id = uVar10;
                HVar5 = type_1;
                auVar23 = auStack_e8;
              }
              uVar22 = uVar22 + 1;
              lVar16 = lVar16 + 0x10;
            } while (uVar22 < (ulong)((long)(HVar5.id - (long)auVar23) >> 4));
          }
          wasm::TypeBuilder::setHeapType((ulong)local_38,(Struct *)TVar20.id);
          break;
        case 3:
          wasm::HeapType::getArray();
          type_1.id = type_1.id & 0xffffffff00000000;
          if ((TStack_88.id & 1) == 0 && (_Hash_node_base *)0x6 < TStack_88.id) {
            auStack_e8 = (undefined1  [8])p_Var7;
            auStack_58 = (undefined1  [8])Type::getHeapType(&stack0xffffffffffffff78);
            bVar25 = (_Hash_node_base *)0x6 < TStack_88.id;
            uVar3 = (uint)TStack_88.id;
            iVar17 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&stack0xfffffffffffffe58,(key_type *)auStack_58);
            if (iVar17.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                _M_cur != (__node_type *)0x0) {
              auStack_58 = (undefined1  [8])wasm::TypeBuilder::getTempHeapType((ulong)local_38);
            }
            cVar9 = std::
                    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&inhabitator,(key_type *)auStack_e8);
            TStack_88.id = wasm::TypeBuilder::getTempRefType
                                     ((HeapType)local_38,auStack_58._0_4_,
                                      (uint)(cVar9.
                                             super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>
                                             ._M_cur != (__node_type *)0x0 ||
                                            bVar25 && (uVar3 & 3) == 2));
          }
          auStack_e8 = (undefined1  [8])TStack_88.id;
          type_1 = heapType;
          AVar26.element._8_8_ = auStack_e8;
          AVar26.element.type.id = TVar20.id;
          wasm::TypeBuilder::setHeapType((ulong)local_38,AVar26);
          goto LAB_00199ae6;
        case 4:
          uVar3 = 0x3b3;
          pcVar21 = "TODO: cont";
          goto LAB_00199ed3;
        default:
          uVar3 = 0x3b7;
          pcVar21 = "unexpected kind";
LAB_00199ed3:
          wasm::handle_unreachable
                    (pcVar21,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                     ,uVar3);
        }
        if (auStack_e8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_e8,-(long)auStack_e8);
        }
LAB_00199ae6:
        TVar20.id = TVar20.id + 1;
        p_Var7 = (typeIndices._M_h._M_single_bucket)->_M_nxt;
        p_Var15 = typeIndices._M_h._M_single_bucket[1]._M_nxt;
      } while (TVar20.id < (Struct *)((long)p_Var15 - (long)p_Var7 >> 3));
    }
    if (p_Var15 != p_Var7) {
      uVar22 = 0;
      do {
        auStack_e8 = (undefined1  [8])wasm::HeapType::getRecGroup();
        lVar16 = wasm::RecGroup::size();
        wasm::TypeBuilder::createRecGroup((ulong)local_38,uVar22);
        uVar22 = uVar22 + lVar16;
      } while (uVar22 < (ulong)((long)typeIndices._M_h._M_single_bucket[1]._M_nxt -
                                (long)(typeIndices._M_h._M_single_bucket)->_M_nxt >> 3));
      if (typeIndices._M_h._M_single_bucket[1]._M_nxt != (typeIndices._M_h._M_single_bucket)->_M_nxt
         ) {
        uVar22 = 0;
        do {
          auStack_e8 = (undefined1  [8])wasm::HeapType::getDeclaredSuperType();
          type_1.id._0_1_ = extraout_DL;
          if ((extraout_DL & 1) != 0) {
            iVar17 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&stack0xfffffffffffffe58,(key_type *)auStack_e8);
            if (iVar17.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                _M_cur == (__node_type *)0x0) {
              wasm::TypeBuilder::setSubType(local_38,uVar22,auStack_e8,1);
            }
            else {
              uVar18 = wasm::TypeBuilder::getTempHeapType((ulong)local_38);
              wasm::TypeBuilder::setSubType(local_38,uVar22,uVar18,1);
            }
          }
          wasm::HeapType::isOpen();
          wasm::TypeBuilder::setOpen((ulong)local_38,SUB81(uVar22,0));
          wasm::HeapType::getShared();
          wasm::TypeBuilder::setShared((ulong)local_38,(Shareability)uVar22);
          uVar22 = uVar22 + 1;
        } while (uVar22 < (ulong)((long)typeIndices._M_h._M_single_bucket[1]._M_nxt -
                                  (long)(typeIndices._M_h._M_single_bucket)->_M_nxt >> 3));
      }
    }
    wasm::TypeBuilder::build();
    __x_00 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_e8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&param,__x_00);
    std::__detail::__variant::
    __gen_vtable_impl<std::__detail::__variant::_Multi_array<void_(*)((lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&)>,_std::integer_sequence<unsigned_long,_0UL>_>
    ::__visit_invoke((anon_class_1_0_00000001 *)&stack0xffffffffffffff78,
                     (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_e8);
    wasm::TypeBuilder::~TypeBuilder(local_38);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&stack0xfffffffffffffe58);
    pHVar1 = local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pHVar19 = local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)param.id;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pTStack_100;
    local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_f8;
    param.id = 0;
    if ((pHVar19 != (pointer)0x0) &&
       (operator_delete(pHVar19,(long)pHVar1 - (long)pHVar19), param.id != 0)) {
      operator_delete((void *)param.id,-param.id);
    }
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pHVar19 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
        super__Vector_impl_data._M_finish != pHVar19) {
      lVar16 = 0;
      uVar22 = 0;
      do {
        if (*(pointer)((long)auStack_158 + uVar22 * 8) == 0xffffffffffffffff) {
          uVar24 = *(ulong *)((long)&pHVar19->id + lVar16);
          if (0x7c < uVar24) {
            __assert_fail("types[i].isBasic()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                          ,0x3f7,
                          "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                         );
          }
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            __args_00 = (HeapType *)((long)&pHVar19->id + lVar16);
            goto LAB_00199dae;
          }
          (__position._M_current)->id = uVar24;
LAB_00199d9e:
          (__return_storage_ptr__->
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        else {
          __args_00 = local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      *(pointer)((long)auStack_158 + uVar22 * 8);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (__return_storage_ptr__->
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            (__position._M_current)->id = __args_00->id;
            goto LAB_00199d9e;
          }
LAB_00199dae:
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__
                     ,__position,__args_00);
        }
        uVar22 = uVar22 + 1;
        pHVar19 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 8;
      } while (uVar22 < (ulong)((long)(types->
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar19 >>
                               3));
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&inhabitator.subtypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (inhabitator.nullables._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(inhabitator.nullables._M_h._M_single_bucket,
                      (long)inhabitator.subtypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inhabitator.nullables._M_h._M_single_bucket);
    }
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&inhabitator);
    if (local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (auStack_158 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_158,
                      (long)deduplicatedIndices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_288);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
HeapTypeGenerator::makeInhabitable(const std::vector<HeapType>& types) {
  if (types.empty()) {
    return {};
  }

  // Remove duplicate and basic types. We will insert them back at the end.
  std::unordered_map<HeapType, size_t> typeIndices;
  std::vector<size_t> deduplicatedIndices;
  std::vector<HeapType> deduplicated;
  for (auto type : types) {
    if (type.isBasic()) {
      deduplicatedIndices.push_back(-1);
      continue;
    }
    auto [it, inserted] = typeIndices.insert({type, deduplicated.size()});
    if (inserted) {
      deduplicated.push_back(type);
    }
    deduplicatedIndices.push_back(it->second);
  }
  assert(deduplicatedIndices.size() == types.size());

  // Construct the new types.
  Inhabitator inhabitator(deduplicated);
  inhabitator.markBottomRefsNullable();
  inhabitator.markExternRefsNullable();
  inhabitator.breakNonNullableCycles();
  deduplicated = inhabitator.build();

  // Re-duplicate and re-insert basic types as necessary.
  std::vector<HeapType> result;
  for (size_t i = 0; i < types.size(); ++i) {
    if (deduplicatedIndices[i] == (size_t)-1) {
      assert(types[i].isBasic());
      result.push_back(types[i]);
    } else {
      result.push_back(deduplicated[deduplicatedIndices[i]]);
    }
  }
  return result;
}